

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O3

void __thiscall Ptex::v2_4::PtexReaderCache::setSearchPath(PtexReaderCache *this,char *path)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar3 = "";
  if (path != (char *)0x0) {
    pcVar3 = path;
  }
  pcVar1 = (char *)(this->_searchpath)._M_string_length;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)&this->_searchpath,0,pcVar1,(ulong)pcVar3);
  this_00 = &this->_searchdirs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->_searchdirs).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  if (path != (char *)0x0) {
    pcVar3 = strchr(path,0x3a);
    if (pcVar3 != (char *)0x0) {
      do {
        iVar2 = (int)pcVar3 - (int)path;
        if (iVar2 != 0) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,path,path + iVar2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                     &local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
        }
        path = pcVar3 + 1;
        pcVar3 = strchr(path,0x3a);
      } while (pcVar3 != (char *)0x0);
    }
    if (*path != '\0') {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      sVar4 = strlen(path);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,path,path + sVar4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

virtual void setSearchPath(const char* path)
    {
        // record path
        _searchpath = path ? path : "";

        // split into dirs
        _searchdirs.clear();

        if (path) {
            const char* cp = path;
            while (1) {
                const char* delim = strchr(cp, ':');
                if (!delim) {
                    if (*cp) _searchdirs.push_back(cp);
                    break;
                }
                int len = int(delim-cp);
                if (len) _searchdirs.push_back(std::string(cp, len));
                cp = delim+1;
            }
        }
    }